

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O0

void __thiscall InlineTable_WithMultipleKeys_Test::TestBody(InlineTable_WithMultipleKeys_Test *this)

{
  pointer *this_00;
  allocator<sax_event_t> *this_01;
  initializer_list<sax_event_t> __l;
  bool bVar1;
  char *message;
  sax_event_t *local_730;
  AssertHelper local_6c0;
  Message local_6b8;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar;
  string local_698;
  allocator local_671;
  string local_670;
  allocator local_649;
  string local_648;
  allocator local_621;
  string local_620;
  allocator local_5f9;
  string local_5f8;
  sax_event_t *local_5d8;
  sax_event_t local_5d0;
  sax_event_t local_578;
  sax_event_t local_520;
  sax_event_t local_4c8;
  sax_event_t local_470;
  sax_event_t local_418;
  sax_event_t local_3c0;
  sax_event_t local_368;
  sax_event_t local_310;
  sax_event_t local_2b8;
  sax_event_t local_260;
  iterator local_208;
  pointer local_200;
  undefined1 local_1f8 [8];
  vector<sax_event_t,_std::allocator<sax_event_t>_> expected_events;
  events_aggregator_t handler;
  allocator local_1b1;
  string local_1b0 [32];
  istringstream local_190 [8];
  istringstream input;
  InlineTable_WithMultipleKeys_Test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b0,"key = {\"key\"=123,\tkey=345 , 123 = \t\'value\' } ",&local_1b1);
  std::__cxx11::istringstream::istringstream(local_190,local_1b0,8);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  this_00 = &expected_events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  events_aggregator_t::events_aggregator_t((events_aggregator_t *)this_00);
  loltoml::v_0_1_1::parse<events_aggregator_t>((istream *)local_190,(events_aggregator_t *)this_00);
  gtest_ar.message_.ptr_._6_1_ = 1;
  local_5d8 = &local_5d0;
  sax_event_t::sax_event_t(local_5d8,start_document);
  local_5d8 = &local_578;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f8,"key",&local_5f9);
  sax_event_t::sax_event_t(&local_578,key,&local_5f8);
  local_5d8 = &local_520;
  sax_event_t::sax_event_t(local_5d8,start_inline_table);
  local_5d8 = &local_4c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_620,"key",&local_621);
  sax_event_t::sax_event_t(&local_4c8,key,&local_620);
  local_5d8 = &local_470;
  sax_event_t::sax_event_t<int>(local_5d8,integer,0x7b,(type *)0x0);
  local_5d8 = &local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_648,"key",&local_649);
  sax_event_t::sax_event_t(&local_418,key,&local_648);
  local_5d8 = &local_3c0;
  sax_event_t::sax_event_t<int>(local_5d8,integer,0x159,(type *)0x0);
  local_5d8 = &local_368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_670,"123",&local_671);
  sax_event_t::sax_event_t(&local_368,key,&local_670);
  local_5d8 = &local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_698,"value",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  sax_event_t::sax_event_t(&local_310,string,&local_698);
  local_5d8 = &local_2b8;
  sax_event_t::sax_event_t<int>(local_5d8,finish_inline_table,3,(type *)0x0);
  local_5d8 = &local_260;
  sax_event_t::sax_event_t(local_5d8,finish_document);
  gtest_ar.message_.ptr_._6_1_ = 0;
  local_208 = &local_5d0;
  local_200 = (pointer)0xb;
  this_01 = (allocator<sax_event_t> *)((long)&gtest_ar.message_.ptr_ + 5);
  std::allocator<sax_event_t>::allocator(this_01);
  __l._M_len = (size_type)local_200;
  __l._M_array = local_208;
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::vector
            ((vector<sax_event_t,_std::allocator<sax_event_t>_> *)local_1f8,__l,this_01);
  std::allocator<sax_event_t>::~allocator
            ((allocator<sax_event_t> *)((long)&gtest_ar.message_.ptr_ + 5));
  local_730 = (sax_event_t *)&local_208;
  do {
    local_730 = local_730 + -1;
    sax_event_t::~sax_event_t(local_730);
  } while (local_730 != &local_5d0);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator((allocator<char> *)&local_649);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  testing::internal::EqHelper<false>::
  Compare<std::vector<sax_event_t,std::allocator<sax_event_t>>,std::vector<sax_event_t,std::allocator<sax_event_t>>>
            ((EqHelper<false> *)local_6b0,"expected_events","handler.events",
             (vector<sax_event_t,_std::allocator<sax_event_t>_> *)local_1f8,
             (vector<sax_event_t,_std::allocator<sax_event_t>_> *)
             &expected_events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/inline_table.cpp"
               ,0x75,message);
    testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector
            ((vector<sax_event_t,_std::allocator<sax_event_t>_> *)local_1f8);
  events_aggregator_t::~events_aggregator_t
            ((events_aggregator_t *)
             &expected_events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::istringstream::~istringstream(local_190);
  return;
}

Assistant:

TEST(InlineTable, WithMultipleKeys) {
    std::istringstream input("key = {\"key\"=123,\tkey=345 , 123 = \t'value' } ");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_inline_table},
        {sax_event_t::key, "key"},
        {sax_event_t::integer, 123},
        {sax_event_t::key, "key"},
        {sax_event_t::integer, 345},
        {sax_event_t::key, "123"},
        {sax_event_t::string, "value"},
        {sax_event_t::finish_inline_table, 3},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}